

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rva.inc.c
# Opt level: O2

_Bool gen_amo(DisasContext_conflict12 *ctx,arg_atomic *a,
             _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_TCGArg_MemOp *func,MemOp mop)

{
  TCGContext_conflict11 *tcg_ctx;
  undefined1 extraout_AL;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_get_gpr(tcg_ctx,t,a->rs1);
  gen_get_gpr(tcg_ctx,t_00,a->rs2);
  (*func)(tcg_ctx,t_00,t,t_00,(TCGArg)ctx->mem_idx,mop);
  gen_set_gpr(tcg_ctx,a->rd,t_00);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return (_Bool)extraout_AL;
}

Assistant:

static bool gen_amo(DisasContext *ctx, arg_atomic *a,
                    void(*func)(TCGContext *, TCGv, TCGv, TCGv, TCGArg, MemOp),
                    MemOp mop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv src1 = tcg_temp_new(tcg_ctx);
    TCGv src2 = tcg_temp_new(tcg_ctx);

    gen_get_gpr(tcg_ctx, src1, a->rs1);
    gen_get_gpr(tcg_ctx, src2, a->rs2);

    (*func)(tcg_ctx, src2, src1, src2, ctx->mem_idx, mop);

    gen_set_gpr(tcg_ctx, a->rd, src2);
    tcg_temp_free(tcg_ctx, src1);
    tcg_temp_free(tcg_ctx, src2);
    return true;
}